

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::javanano::JavaNanoGenerator::Generate
          (JavaNanoGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *output_directory,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FileDescriptor *file_00;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  long *plVar5;
  undefined7 extraout_var;
  ZeroCopyOutputStream *pZVar6;
  undefined4 extraout_var_01;
  size_type *psVar7;
  ulong uVar8;
  GeneratorContext *output_directory_00;
  undefined1 uVar9;
  long lVar10;
  string *psVar11;
  long lVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  string package_dir;
  string java_filename;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string output_list_file;
  FileGenerator file_generator;
  string option_name;
  Params params;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  string *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  GeneratorContext *local_240;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  undefined1 *local_218;
  long local_210;
  undefined1 local_208;
  undefined7 uStack_207;
  FileDescriptor *local_1f8;
  undefined1 local_1f0 [16];
  string local_1e0;
  _Alloc_hider local_1c0;
  undefined1 local_1a0 [136];
  Params local_118;
  undefined4 extraout_var_00;
  
  local_238.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288 = error;
  ParseGeneratorParameter(parameter,&local_238);
  local_218 = &local_208;
  local_210 = 0;
  local_208 = 0;
  Params::Params(&local_118,*(string **)file);
  local_240 = output_directory;
  local_1f8 = file;
  UpdateParamsRecursively(&local_118,file);
  if (local_238.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_238.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar12 = 0x20;
    uVar8 = 0;
    do {
      anon_unknown_4::TrimString
                ((string *)local_1a0,
                 (string *)
                 ((long)local_238.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar12 + -0x20));
      anon_unknown_4::TrimString
                ((string *)local_1f0,
                 (string *)
                 ((long)&((local_238.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                 lVar12));
      iVar3 = std::__cxx11::string::compare((char *)local_1a0);
      if (iVar3 == 0) {
        std::__cxx11::string::_M_assign((string *)&local_218);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_1a0);
        if (iVar3 == 0) {
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          SplitStringUsing((string *)local_1f0,"|",&local_2a8);
          lVar10 = (long)local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar10 == 0x40) {
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&local_118.java_packages_,
                                  local_2a8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::string::_M_assign((string *)pmVar4);
          }
          else {
            std::operator+(&local_260,"Bad java_package, expecting filename|PackageName found \'",
                           (string *)local_1f0);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
LAB_0021b8ea:
            psVar7 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_280.field_2._M_allocated_capacity = *psVar7;
              local_280.field_2._8_8_ = plVar5[3];
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            }
            else {
              local_280.field_2._M_allocated_capacity = *psVar7;
              local_280._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_280._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_288,(string *)&local_280);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_1a0);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)local_1a0);
            if (iVar3 == 0) {
              iVar3 = std::__cxx11::string::compare((char *)local_1f0);
              local_118.store_unknown_fields_ = iVar3 == 0;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)local_1a0);
              if (iVar3 == 0) {
                iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                if (iVar3 == 0) {
                  local_118.override_java_multiple_files_ = JAVANANO_MUL_TRUE;
                }
                else {
                  local_118.override_java_multiple_files_ = JAVANANO_MUL_FALSE;
                }
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)local_1a0);
                if (iVar3 == 0) {
                  iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                  local_118.generate_has_ = iVar3 == 0;
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)local_1a0);
                  if (iVar3 == 0) {
                    iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                    local_118.java_enum_style_ = iVar3 == 0;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)local_1a0);
                    if (iVar3 == 0) {
                      iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                      local_118.optional_field_accessors_ = iVar3 == 0;
                      iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                      if (iVar3 == 0) {
                        local_118.use_reference_types_for_primitives_ = true;
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                        local_118.use_reference_types_for_primitives_ = iVar3 == 0;
                      }
                      iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                      local_118.reftypes_primitive_enums_ = iVar3 == 0;
                      iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                      if (iVar3 == 0) {
                        local_118.generate_clear_ = false;
                      }
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)local_1a0);
                      if (iVar3 == 0) {
                        iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                        local_118.generate_equals_ = iVar3 == 0;
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)local_1a0);
                        if (iVar3 == 0) {
                          iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                          local_118.ignore_services_ = iVar3 == 0;
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)local_1a0);
                          if (iVar3 == 0) {
                            iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                            local_118.parcelable_messages_ = iVar3 == 0;
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)local_1a0);
                            if (iVar3 == 0) {
                              iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                              local_118.generate_clone_ = iVar3 == 0;
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)local_1a0);
                              if (iVar3 == 0) {
                                iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                                local_118.generate_intdefs_ = iVar3 == 0;
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)local_1a0);
                                if (iVar3 == 0) {
                                  iVar3 = std::__cxx11::string::compare((char *)local_1f0);
                                  local_118.generate_clear_ = iVar3 == 0;
                                }
                                else {
                                  std::operator+(&local_280,
                                                 "Ignore unknown javanano generator option: ",
                                                 (string *)local_1a0);
                                  std::__cxx11::string::operator=
                                            ((string *)local_288,(string *)&local_280);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_280._M_dataplus._M_p != &local_280.field_2) {
                                    operator_delete(local_280._M_dataplus._M_p,
                                                    local_280.field_2._M_allocated_capacity + 1);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_0021b995;
          }
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          SplitStringUsing((string *)local_1f0,"|",&local_2a8);
          lVar10 = (long)local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar10 != 0x40) {
            std::operator+(&local_260,
                           "Bad java_outer_classname, expecting filename|ClassName found \'",
                           (string *)local_1f0);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
            goto LAB_0021b8ea;
          }
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&local_118.java_outer_classnames_,
                                local_2a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::_M_assign((string *)pmVar4);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2a8);
        if (lVar10 != 0x40) {
          if ((string *)local_1f0._0_8_ != &local_1e0) {
            operator_delete((void *)local_1f0._0_8_,(long)local_1e0._M_dataplus._M_p + 1);
          }
          if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
            operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
          }
          uVar9 = 0;
          goto LAB_0021bf06;
        }
      }
LAB_0021b995:
      if ((string *)local_1f0._0_8_ != &local_1e0) {
        operator_delete((void *)local_1f0._0_8_,(long)local_1e0._M_dataplus._M_p + 1);
      }
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      uVar8 = uVar8 + 1;
      lVar12 = lVar12 + 0x40;
    } while (uVar8 < (ulong)((long)local_238.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_238.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  file_00 = local_1f8;
  if ((local_118.generate_has_ == true) &&
     ((local_118.optional_field_accessors_ != false ||
      (local_118.use_reference_types_for_primitives_ == true)))) {
    uVar9 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)local_288,0,(char *)local_288->_M_string_length,0x357d7c);
  }
  else {
    FileGenerator::FileGenerator((FileGenerator *)local_1f0,local_1f8,&local_118);
    bVar2 = FileGenerator::Validate((FileGenerator *)local_1f0,local_288);
    psVar11 = (string *)(CONCAT71(extraout_var,bVar2) & 0xffffffff);
    if (bVar2) {
      local_1a0._0_8_ = local_1a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,".","");
      paVar1 = &local_260.field_2;
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/","");
      StringReplace(&local_280,&local_1e0,(string *)local_1a0,&local_260,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      output_directory_00 = local_240;
      if (local_280._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_280);
      }
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = IsOuterClassNeeded(&local_118,file_00);
      if (bVar2) {
        local_260._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_260,local_280._M_dataplus._M_p,
                   local_280._M_dataplus._M_p + local_280._M_string_length);
        std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_1c0._M_p);
        std::__cxx11::string::append((char *)&local_260);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2a8,&local_260);
        iVar3 = (*output_directory_00->_vptr_GeneratorContext[2])(output_directory_00,&local_260);
        pZVar6 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3);
        io::Printer::Printer((Printer *)local_1a0,pZVar6,'$');
        FileGenerator::Generate((FileGenerator *)local_1f0,(Printer *)local_1a0);
        io::Printer::~Printer((Printer *)local_1a0);
        if (pZVar6 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar6->_vptr_ZeroCopyOutputStream[1])(pZVar6);
        }
        output_directory_00 = local_240;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != paVar1) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          output_directory_00 = local_240;
        }
      }
      FileGenerator::GenerateSiblings
                ((FileGenerator *)local_1f0,&local_280,output_directory_00,&local_2a8);
      if (local_210 != 0) {
        iVar3 = (*output_directory_00->_vptr_GeneratorContext[2])(output_directory_00,&local_218);
        pZVar6 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar3);
        local_288 = psVar11;
        io::Printer::Printer((Printer *)local_1a0,pZVar6,'$');
        if (local_2a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_2a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar12 = 0;
          uVar8 = 0;
          do {
            io::Printer::Print((Printer *)local_1a0,"$filename$\n","filename",
                               (string *)
                               ((long)&((local_2a8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar12));
            uVar8 = uVar8 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar8 < (ulong)((long)local_2a8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_2a8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        io::Printer::~Printer((Printer *)local_1a0);
        psVar11 = local_288;
        if (pZVar6 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar6->_vptr_ZeroCopyOutputStream[1])(pZVar6);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
    }
    uVar9 = SUB81(psVar11,0);
    FileGenerator::~FileGenerator((FileGenerator *)local_1f0);
  }
LAB_0021bf06:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_118.java_multiple_files_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_118.java_outer_classnames_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_118.java_packages_._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.base_name_._M_dataplus._M_p != &local_118.base_name_.field_2) {
    operator_delete(local_118.base_name_._M_dataplus._M_p,
                    local_118.base_name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.empty_._M_dataplus._M_p != &local_118.empty_.field_2) {
    operator_delete(local_118.empty_._M_dataplus._M_p,
                    local_118.empty_.field_2._M_allocated_capacity + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_238);
  return (bool)uVar9;
}

Assistant:

bool JavaNanoGenerator::Generate(const FileDescriptor* file,
                             const string& parameter,
                             GeneratorContext* output_directory,
                             string* error) const {
  vector<pair<string, string> > options;

  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // Name a file where we will write a list of generated file names, one
  // per line.
  string output_list_file;
  Params params(file->name());

  // Update per file params
  UpdateParamsRecursively(params, file);

  // Replace any existing options with ones from command line
  for (int i = 0; i < options.size(); i++) {
    string option_name = TrimString(options[i].first);
    string option_value = TrimString(options[i].second);
    if (option_name == "output_list_file") {
      output_list_file = option_value;
    } else if (option_name == "java_package") {
        vector<string> parts;
        SplitStringUsing(option_value, "|", &parts);
        if (parts.size() != 2) {
          *error = "Bad java_package, expecting filename|PackageName found '"
            + option_value + "'";
          return false;
        }
        params.set_java_package(parts[0], parts[1]);
    } else if (option_name == "java_outer_classname") {
        vector<string> parts;
        SplitStringUsing(option_value, "|", &parts);
        if (parts.size() != 2) {
          *error = "Bad java_outer_classname, "
                   "expecting filename|ClassName found '"
                   + option_value + "'";
          return false;
        }
        params.set_java_outer_classname(parts[0], parts[1]);
    } else if (option_name == "store_unknown_fields") {
      params.set_store_unknown_fields(option_value == "true");
    } else if (option_name == "java_multiple_files") {
      params.set_override_java_multiple_files(option_value == "true");
    } else if (option_name == "java_nano_generate_has") {
      params.set_generate_has(option_value == "true");
    } else if (option_name == "enum_style") {
      params.set_java_enum_style(option_value == "java");
    } else if (option_name == "optional_field_style") {
      params.set_optional_field_accessors(option_value == "accessors");
      params.set_use_reference_types_for_primitives(option_value == "reftypes"
          || option_value == "reftypes_compat_mode");
      params.set_reftypes_primitive_enums(
          option_value == "reftypes_compat_mode");
      if (option_value == "reftypes_compat_mode") {
        params.set_generate_clear(false);
      }
    } else if (option_name == "generate_equals") {
      params.set_generate_equals(option_value == "true");
    } else if (option_name == "ignore_services") {
      params.set_ignore_services(option_value == "true");
    } else if (option_name == "parcelable_messages") {
      params.set_parcelable_messages(option_value == "true");
    } else if (option_name == "generate_clone") {
      params.set_generate_clone(option_value == "true");
    } else if (option_name == "generate_intdefs") {
      params.set_generate_intdefs(option_value == "true");
    } else if (option_name == "generate_clear") {
      params.set_generate_clear(option_value == "true");
    } else {
      *error = "Ignore unknown javanano generator option: " + option_name;
    }
  }

  // Check illegal parameter combinations
  // Note: the enum-like optional_field_style generator param ensures
  // that we can never have illegal combinations of field styles
  // (e.g. reftypes and accessors can't be on at the same time).
  if (params.generate_has()
      && (params.optional_field_accessors()
          || params.use_reference_types_for_primitives())) {
    error->assign("java_nano_generate_has=true cannot be used in conjunction"
        " with optional_field_style=accessors or optional_field_style=reftypes");
    return false;
  }

  // -----------------------------------------------------------------

  FileGenerator file_generator(file, params);
  if (!file_generator.Validate(error)) {
    return false;
  }

  string package_dir =
    StringReplace(file_generator.java_package(), ".", "/", true);
  if (!package_dir.empty()) package_dir += "/";

  vector<string> all_files;

  if (IsOuterClassNeeded(params, file)) {
    string java_filename = package_dir;
    java_filename += file_generator.classname();
    java_filename += ".java";
    all_files.push_back(java_filename);

    // Generate main java file.
    scoped_ptr<io::ZeroCopyOutputStream> output(
      output_directory->Open(java_filename));
    io::Printer printer(output.get(), '$');
    file_generator.Generate(&printer);
  }

  // Generate sibling files.
  file_generator.GenerateSiblings(package_dir, output_directory, &all_files);

  // Generate output list if requested.
  if (!output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    scoped_ptr<io::ZeroCopyOutputStream> srclist_raw_output(
      output_directory->Open(output_list_file));
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (int i = 0; i < all_files.size(); i++) {
      srclist_printer.Print("$filename$\n", "filename", all_files[i]);
    }
  }

  return true;
}